

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

sat_solver * Pdr_ManFetchSolver(Pdr_Man_t *p,int k)

{
  int iVar1;
  void *pvVar2;
  sat_solver *s;
  Vec_Vec_t *pVVar3;
  long lVar4;
  ulong uVar5;
  
  if (-1 < k) {
    uVar5 = (ulong)(uint)k;
    iVar1 = p->vSolvers->nSize;
    if (k < iVar1) {
      if (p->vActVars->nSize <= k) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      s = (sat_solver *)p->vSolvers->pArray[uVar5];
      if (p->pPars->nRecycle <= p->vActVars->pArray[uVar5]) {
        if (iVar1 - 1U <= (uint)k) {
          __assert_fail("k < Vec_PtrSize(p->vSolvers) - 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                        ,0x56,"sat_solver *Pdr_ManFetchSolver(Pdr_Man_t *, int)");
        }
        p->nStarts = p->nStarts + 1;
        zsat_solver_restart_seed(s,(double)p->pPars->nRandomSeed);
        s = Pdr_ManNewSolver(s,p,k,(uint)(k == 0));
        if (p->vSolvers->nSize <= k) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        p->vSolvers->pArray[uVar5] = s;
        if (p->vActVars->nSize <= k) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vActVars->pArray[uVar5] = 0;
        Pdr_ManSetPropertyOutput(p,k);
        pVVar3 = p->vClauses;
        if (k < pVVar3->nSize) {
          do {
            pvVar2 = pVVar3->pArray[uVar5];
            if (0 < *(int *)((long)pvVar2 + 4)) {
              lVar4 = 0;
              do {
                Pdr_ManSolverAddClause(p,k,*(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + lVar4 * 8))
                ;
                lVar4 = lVar4 + 1;
              } while (lVar4 < *(int *)((long)pvVar2 + 4));
              pVVar3 = p->vClauses;
            }
            uVar5 = uVar5 + 1;
          } while ((int)uVar5 < pVVar3->nSize);
        }
      }
      return s;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

sat_solver * Pdr_ManFetchSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    pSat = Pdr_ManSolver(p, k);
    if ( Vec_IntEntry(p->vActVars, k) < p->pPars->nRecycle )
        return pSat;
    assert( k < Vec_PtrSize(p->vSolvers) - 1 );
    p->nStarts++;
//    sat_solver_delete( pSat );
//    pSat = sat_solver_new();
//    sat_solver_restart( pSat );
    zsat_solver_restart_seed( pSat, p->pPars->nRandomSeed );
    // create new SAT solver
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    // write new SAT solver
    Vec_PtrWriteEntry( p->vSolvers, k, pSat );
    Vec_IntWriteEntry( p->vActVars, k, 0 );
    // set the property output
    Pdr_ManSetPropertyOutput( p, k );
    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}